

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

void ListSilentOrExternalEmits(void)

{
  char silentOrExternalBytes [61];
  char local_48 [64];
  
  if (nListBytes != 0) {
    substitutedLine = local_48;
    CompiledCurrentLine = CompiledCurrentLine + 1;
    builtin_strncpy(local_48 + 0x30,"lua script?)",0xd);
    builtin_strncpy(local_48 + 0x20,"tly/externally (",0x10);
    builtin_strncpy(local_48 + 0x10,"re emitted silen",0x10);
    builtin_strncpy(local_48,"; these bytes we",0x10);
    eolComment = (char *)0x0;
    ListFile(false);
    substitutedLine = line;
  }
  return;
}

Assistant:

void ListSilentOrExternalEmits() {
	// catch silent/external emits like "sj.add_byte(0x123)" from Lua script
	if (0 == nListBytes) return;		// no silent/external emit happened
	++CompiledCurrentLine;
	char silentOrExternalBytes[] = "; these bytes were emitted silently/externally (lua script?)";
	substitutedLine = silentOrExternalBytes;
	eolComment = nullptr;
	ListFile();
	substitutedLine = line;
}